

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

void Nf_ManResetMatches(Nf_Man_t *p,int Round)

{
  uint uVar1;
  Nf_Obj_t *pNVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  Nf_Cfg_t NVar7;
  int iVar8;
  Gia_Obj_t *pObj;
  Nf_Mat_t *pNVar9;
  int *piVar10;
  word wVar11;
  uint *puVar12;
  uint *puVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int v;
  long lVar18;
  bool bVar19;
  Nf_Mat_t t;
  Nf_Mat_t *pM [2];
  uint *local_58 [3];
  long local_40;
  long local_38;
  
  lVar16 = 0;
  lVar18 = 0;
  do {
    if (p->pGia->nObjs <= lVar18) {
      return;
    }
    v = (int)lVar18;
    pObj = Gia_ManObj(p->pGia,v);
    if (pObj == (Gia_Obj_t *)0x0) {
      return;
    }
    uVar14 = (uint)*(undefined8 *)pObj;
    if ((~uVar14 & 0x1fffffff) != 0 && -1 < (int)uVar14) {
      iVar8 = Gia_ObjIsBuf(pObj);
      if (iVar8 == 0) {
        local_38 = lVar18 * 0x60;
        lVar17 = lVar16;
        local_40 = lVar16;
        for (lVar15 = 0; lVar16 = local_40, pNVar2 = p->pNfObjs, lVar15 != 2; lVar15 = lVar15 + 1) {
          puVar12 = (uint *)(&pNVar2->M[0][1].field_0x0 + lVar17);
          puVar12[4] = 0;
          puVar12[5] = 0;
          puVar13 = (uint *)(&pNVar2->M[0][0].field_0x0 + lVar17);
          puVar12[-2] = 0;
          puVar12[-1] = 0;
          iVar8 = Nf_ObjMapRefNum(p,v,(int)lVar15);
          if (iVar8 == 0) {
            if (Round < 1) {
              if (((int)*puVar13 < 0) || (uVar14 = *puVar12, (int)uVar14 < 0)) {
                __assert_fail("Round > 0 || (!pDc->fBest && !pAc->fBest)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                              ,0x769,"void Nf_ManResetMatches(Nf_Man_t *, int)");
              }
            }
            else {
              uVar14 = *puVar12;
            }
            if ((p->pPars->fAreaOnly != 0 || (Round & 1U) != 0) && ((uVar14 & 0x40000000) == 0)) {
              uVar3 = *(undefined8 *)(puVar13 + 4);
              uVar4 = *(undefined8 *)puVar13;
              uVar5 = *(undefined8 *)(puVar13 + 2);
              *(undefined8 *)(puVar13 + 4) = *(undefined8 *)(puVar12 + 4);
              uVar6 = *(undefined8 *)(puVar12 + 2);
              *(undefined8 *)puVar13 = *(undefined8 *)puVar12;
              *(undefined8 *)(puVar13 + 2) = uVar6;
              *(undefined8 *)(puVar12 + 4) = uVar3;
              *(undefined8 *)puVar12 = uVar4;
              *(undefined8 *)(puVar12 + 2) = uVar5;
              uVar14 = puVar13[6];
            }
            *(byte *)((long)puVar13 + 3) = *(byte *)((long)puVar13 + 3) | 0x80;
            puVar13[6] = uVar14 & 0x7fffffff;
          }
          else {
            uVar14 = *puVar13;
            if (-1 < (int)(puVar13[6] ^ uVar14)) {
              __assert_fail("pDc->fBest != pAc->fBest",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                            ,0x761,"void Nf_ManResetMatches(Nf_Man_t *, int)");
            }
            if ((int)puVar13[6] < 0) {
              uVar3 = *(undefined8 *)(puVar13 + 4);
              uVar4 = *(undefined8 *)puVar13;
              uVar5 = *(undefined8 *)(puVar13 + 2);
              *(undefined8 *)(puVar13 + 4) = *(undefined8 *)(puVar12 + 4);
              uVar6 = *(undefined8 *)(puVar12 + 2);
              *(undefined8 *)puVar13 = *(undefined8 *)puVar12;
              *(undefined8 *)(puVar13 + 2) = uVar6;
              *(undefined8 *)(puVar12 + 4) = uVar3;
              *(undefined8 *)puVar12 = uVar4;
              *(undefined8 *)(puVar12 + 2) = uVar5;
              uVar14 = *puVar13;
            }
            if (-1 < (int)uVar14) {
              __assert_fail("pDc->fBest",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                            ,0x764,"void Nf_ManResetMatches(Nf_Man_t *, int)");
            }
            if ((int)*puVar12 < 0) {
              __assert_fail("!pAc->fBest",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                            ,0x765,"void Nf_ManResetMatches(Nf_Man_t *, int)");
            }
          }
          lVar17 = lVar17 + 0x30;
        }
        local_58[0] = (uint *)(&pNVar2->M[0][0].field_0x0 + local_38);
        local_58[1] = local_58[0] + 0xc;
        uVar14 = *local_58[0];
        if ((-1 < (int)uVar14) || (uVar1 = local_58[0][0xc], -1 < (int)uVar1)) {
          __assert_fail("pM[0]->fBest && pM[1]->fBest",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                        ,0x773,"void Nf_ManResetMatches(Nf_Man_t *, int)");
        }
        if (((uVar14 & uVar1) >> 0x1e & 1) != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                        ,0x779,"void Nf_ManResetMatches(Nf_Man_t *, int)");
        }
        if (((uVar1 | uVar14) >> 0x1e & 1) == 0) {
          for (lVar17 = 0; lVar17 != 2; lVar17 = lVar17 + 1) {
            pNVar9 = (Nf_Mat_t *)local_58[lVar17];
            piVar10 = Nf_ObjCutSet(p,v);
            wVar11 = Nf_ManComputeArrival(p,pNVar9,piVar10);
            pNVar9->D = wVar11;
          }
        }
        else {
          pNVar9 = (Nf_Mat_t *)local_58[(uVar1 & 0x40000000) == 0];
          if ((pNVar9->field_0x3 & 0x40) != 0) {
            __assert_fail("!pM[c]->fCompl",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                          ,0x789,"void Nf_ManResetMatches(Nf_Man_t *, int)");
          }
          puVar12 = local_58[(uVar1 & 0x40000000) >> 0x1e];
          if ((*puVar12 & 0x40000000) == 0) {
            __assert_fail("pM[!c]->fCompl",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                          ,0x78a,"void Nf_ManResetMatches(Nf_Man_t *, int)");
          }
          piVar10 = Nf_ObjCutSet(p,v);
          wVar11 = Nf_ManComputeArrival(p,pNVar9,piVar10);
          pNVar9->D = wVar11;
          *(word *)(puVar12 + 4) = pNVar9->A;
          NVar7 = pNVar9->Cfg;
          wVar11 = pNVar9->D;
          puVar12[0] = *(undefined4 *)&pNVar9->field_0x0;
          puVar12[1] = (uint)NVar7;
          *(word *)(puVar12 + 2) = wVar11;
          *(word *)(puVar12 + 2) = *(long *)(puVar12 + 2) + p->InvDelay;
          *(byte *)((long)puVar12 + 3) = *(byte *)((long)puVar12 + 3) | 0x40;
        }
      }
      else {
        pNVar9 = Nf_ObjMatchBest(p,v - (uVar14 & 0x1fffffff),uVar14 >> 0x1d & 1);
        pNVar2 = p->pNfObjs;
        lVar17 = 0;
        while (lVar17 != 0x60) {
          *(undefined8 *)((long)&pNVar2->M[0][1].A + lVar17 + lVar16) = 0;
          *(undefined8 *)((long)&pNVar2->M[0][0].A + lVar17 + lVar16) = 0;
          if (lVar17 == 0) {
            wVar11 = 0;
          }
          else {
            wVar11 = p->InvArea;
          }
          *(word *)((long)&pNVar2->M[0][0].D + lVar17 + lVar16) = wVar11 + pNVar9->D;
          uVar14 = *(uint *)(&pNVar2->M[0][0].field_0x0 + lVar17 + lVar16);
          if (-1 < (int)uVar14) {
            __assert_fail("pDc->fBest",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                          ,0x753,"void Nf_ManResetMatches(Nf_Man_t *, int)");
          }
          if (*(int *)(&pNVar2->M[0][1].field_0x0 + lVar17 + lVar16) < 0) {
            __assert_fail("!pAc->fBest",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                          ,0x754,"void Nf_ManResetMatches(Nf_Man_t *, int)");
          }
          lVar15 = lVar17 + 0x30;
          bVar19 = lVar17 != 0;
          lVar17 = lVar15;
          if ((bVar19) && ((uVar14 & 0x40000000) == 0)) {
            __assert_fail("c==0 || pDc->fCompl",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                          ,0x755,"void Nf_ManResetMatches(Nf_Man_t *, int)");
          }
        }
      }
    }
    lVar18 = lVar18 + 1;
    lVar16 = lVar16 + 0x60;
  } while( true );
}

Assistant:

void Nf_ManResetMatches( Nf_Man_t * p, int Round )
{
    Gia_Obj_t * pObj;
    Nf_Mat_t * pDc, * pAc, * pMfan, * pM[2]; 
    word Arrival; int i, c;
    // go through matches in the topo order
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) )
        {
            pMfan = Nf_ObjMatchBest( p, Gia_ObjFaninId0(pObj, i), Gia_ObjFaninC0(pObj) );
            for ( c = 0; c < 2; c++ )
            {
                pDc = Nf_ObjMatchD( p, i, c );
                pAc = Nf_ObjMatchA( p, i, c );
                pDc->A = pAc->A = 0;
                pDc->D = pMfan->D + (c ? p->InvArea : 0); 
                assert( pDc->fBest );
                assert( !pAc->fBest );
                assert( c==0 || pDc->fCompl );
            }
            continue;
        }
        // select the best match for each phase
        for ( c = 0; c < 2; c++ )
        {
            pDc = Nf_ObjMatchD( p, i, c );
            pAc = Nf_ObjMatchA( p, i, c );
            pDc->A = pAc->A = 0;
            if ( Nf_ObjMapRefNum(p, i, c) )
            {
                assert( pDc->fBest != pAc->fBest );
                if ( pAc->fBest )
                    ABC_SWAP( Nf_Mat_t, *pDc, *pAc );
                assert( pDc->fBest );
                assert( !pAc->fBest );
            }
            else
            {
                assert( Round > 0 || (!pDc->fBest && !pAc->fBest) );
                if ( (p->pPars->fAreaOnly || (Round & 1)) && !pAc->fCompl )
                    ABC_SWAP( Nf_Mat_t, *pDc, *pAc );
                pDc->fBest = 1;
                pAc->fBest = 0;
            }
        }
        // consider best matches of both phases
        pM[0] = Nf_ObjMatchD( p, i, 0 );
        pM[1] = Nf_ObjMatchD( p, i, 1 );
        assert( pM[0]->fBest && pM[1]->fBest );
        // swap complemented matches
        if ( pM[0]->fCompl && pM[1]->fCompl )
        {
//            pM[0]->fCompl = pM[1]->fCompl = 0;
//            ABC_SWAP( Nf_Mat_t *, pM[0], pM[1] );
            assert( 0 );
        }
        if ( !pM[0]->fCompl && !pM[1]->fCompl )
        {
            for ( c = 0; c < 2; c++ )
            {
                Arrival = Nf_ManComputeArrival( p, pM[c], Nf_ObjCutSet(p, i) );
                //if ( Nf_ObjMapRefNum(p, i, c) )
                //    assert( Round || Arrival <= pM[c]->D );
                pM[c]->D = Arrival;
            }
        }
        else 
        {
            // consider non-complemented match
            c = !pM[1]->fCompl;
            assert( !pM[c]->fCompl );
            assert( pM[!c]->fCompl );
            Arrival = Nf_ManComputeArrival( p, pM[c], Nf_ObjCutSet(p, i) );
            //if ( Nf_ObjMapRefNum(p, i, c) )
            //    assert( Round || Arrival <= pM[c]->D );
            pM[c]->D = Arrival;
            // consider complemented match
            Arrival = pM[!c]->D;
            *pM[!c] = *pM[c];
            pM[!c]->D += p->InvDelay;
            pM[!c]->fCompl = 1;
            //if ( Nf_ObjMapRefNum(p, i, !c) )
            //    assert( Round || pM[!c]->D <= Arrival );
        }
    }
}